

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserPOMDPFormat_Spirit.cpp
# Opt level: O0

void __thiscall
POMDPFormatParsing::ParserPOMDPFormat_Spirit::ProcessORow::operator()
          (ProcessORow *this,iterator_t *str,iterator_t *end)

{
  uint uVar1;
  bool bVar2;
  size_type sVar3;
  ostream *poVar4;
  undefined8 uVar5;
  POMDPDiscrete *pPVar6;
  reference pvVar7;
  reference puVar8;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  *in_RSI;
  long *in_RDI;
  Index joI;
  Index jaI;
  iterator jaI_last;
  iterator jaI_it;
  Index sucSI;
  iterator sI_last;
  iterator sI_it;
  Index si;
  stringstream ss_2;
  size_t nrJO;
  size_t nrS;
  vector<double,_std::allocator<double>_> row;
  stringstream ss_1;
  stringstream ss;
  stringstream *in_stack_fffffffffffff9e8;
  undefined4 in_stack_fffffffffffff9f0;
  uint in_stack_fffffffffffff9f4;
  uint in_stack_fffffffffffff9f8;
  uint in_stack_fffffffffffff9fc;
  MultiAgentDecisionProcessDiscrete *in_stack_fffffffffffffa00;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffa38;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffa40;
  uint local_520;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_510;
  uint local_504;
  uint *local_500;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_4f8;
  uint local_4ec;
  stringstream local_4e8 [16];
  ostream local_4d8 [376];
  size_type local_360;
  ulong local_358;
  vector<double,_std::allocator<double>_> local_350;
  stringstream local_338 [16];
  ostream local_328 [392];
  stringstream local_1a0 [16];
  ostream local_190 [400];
  
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(*in_RDI + 0x118));
  if (sVar3 != 1) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::operator<<(local_190,"ProcessORow:_m_lp_fromSI has size != 1. (at ");
    boost::spirit::classic::
    position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
    ::get_position(in_RSI);
    poVar4 = POMDPFormatParsing::operator<<
                       ((ostream *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                        (file_position *)in_stack_fffffffffffff9e8);
    poVar4 = std::operator<<(poVar4,")");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    uVar5 = __cxa_allocate_exception(0x28);
    E::E((E *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
         in_stack_fffffffffffff9e8);
    __cxa_throw(uVar5,&E::typeinfo,E::~E);
  }
  bVar2 = IsRowMatrixLP((ParserPOMDPFormat_Spirit *)
                        CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
  if (bVar2) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)(*in_RDI + 0x60),0);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
    pPVar6 = GetPOMDPDiscrete((ParserPOMDPFormat_Spirit *)*in_RDI);
    local_358 = (**(code **)(*(long *)&(pPVar6->super_DecPOMDPDiscrete).
                                       super_MultiAgentDecisionProcessDiscrete.
                                       super_MultiAgentDecisionProcess + 0x30))();
    pPVar6 = GetPOMDPDiscrete((ParserPOMDPFormat_Spirit *)*in_RDI);
    local_360 = (**(code **)(*(long *)&(pPVar6->super_DecPOMDPDiscrete).
                                       super_MultiAgentDecisionProcessDiscrete.
                                       super_MultiAgentDecisionProcess + 0xd0))();
    sVar3 = std::vector<double,_std::allocator<double>_>::size(&local_350);
    if (sVar3 == local_360) {
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(*in_RDI + 0x118),0
                         );
      if (*pvVar7 == *(value_type *)(*in_RDI + 0x5c)) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xa479cd);
        for (local_4ec = 0; local_4ec < local_358; local_4ec = local_4ec + 1) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffffa00,
                     (value_type_conflict1 *)
                     CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
        }
      }
      local_4f8._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              in_stack_fffffffffffff9e8);
      local_500 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                     in_stack_fffffffffffff9e8);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                                (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                 *)in_stack_fffffffffffff9e8), bVar2) {
        puVar8 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&local_4f8);
        local_504 = *puVar8;
        local_510._M_current =
             (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                in_stack_fffffffffffff9e8);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff9e8)
        ;
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                   *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                                  (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                   *)in_stack_fffffffffffff9e8), bVar2) {
          puVar8 = __gnu_cxx::
                   __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator*(&local_510);
          uVar1 = *puVar8;
          for (local_520 = 0; local_520 < local_360; local_520 = local_520 + 1) {
            in_stack_fffffffffffffa00 =
                 (MultiAgentDecisionProcessDiscrete *)
                 GetPOMDPDiscrete((ParserPOMDPFormat_Spirit *)*in_RDI);
            in_stack_fffffffffffff9f4 = uVar1;
            in_stack_fffffffffffff9f8 = local_504;
            in_stack_fffffffffffff9fc = local_520;
            std::vector<double,_std::allocator<double>_>::operator[](&local_350,(ulong)local_520);
            MultiAgentDecisionProcessDiscrete::SetObservationProbability
                      (in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8
                       ,in_stack_fffffffffffff9f4,(double)in_stack_fffffffffffff9e8);
          }
          __gnu_cxx::
          __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
          ::operator++((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                       in_stack_fffffffffffff9f4);
        }
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                     in_stack_fffffffffffff9f4);
      }
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa00);
      return;
    }
    std::__cxx11::stringstream::stringstream(local_4e8);
    poVar4 = std::operator<<(local_4d8,"ProcessORow: exected a row matrix with nrJO=");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_360);
    poVar4 = std::operator<<(poVar4," entries. Found ");
    sVar3 = std::vector<double,_std::allocator<double>_>::size(&local_350);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar3);
    std::operator<<(poVar4," entries. (at ");
    boost::spirit::classic::
    position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
    ::get_position(in_RSI);
    poVar4 = POMDPFormatParsing::operator<<
                       ((ostream *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                        (file_position *)in_stack_fffffffffffff9e8);
    poVar4 = std::operator<<(poVar4,")");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    uVar5 = __cxa_allocate_exception(0x28);
    E::E((E *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
         in_stack_fffffffffffff9e8);
    __cxa_throw(uVar5,&E::typeinfo,E::~E);
  }
  std::__cxx11::stringstream::stringstream(local_338);
  std::operator<<(local_328,"ProcessORow: a row matrix should have been parsed. (at ");
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::get_position(in_RSI);
  poVar4 = POMDPFormatParsing::operator<<
                     ((ostream *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                      (file_position *)in_stack_fffffffffffff9e8);
  poVar4 = std::operator<<(poVar4,")");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  uVar5 = __cxa_allocate_exception(0x28);
  E::E((E *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),in_stack_fffffffffffff9e8)
  ;
  __cxa_throw(uVar5,&E::typeinfo,E::~E);
}

Assistant:

void ParserPOMDPFormat_Spirit::ProcessORow::operator()(iterator_t str, iterator_t end) const
{
    if( _m_po->_m_lp_toSI.size() != 1 )
    {
        stringstream ss; ss<<"ProcessORow:_m_lp_fromSI has size != 1. (at " <<str.get_position()<<")"<<endl; throw E(ss);
    }
    if( !_m_po->IsRowMatrixLP() )
    {
        stringstream ss; ss<<"ProcessORow: a row matrix should have been parsed. (at " <<str.get_position()<<")"<<endl; throw E(ss);
    }
    vector<double> row = _m_po->_m_curMatrix[0];
    size_t nrS = _m_po->GetPOMDPDiscrete()->GetNrStates();
    size_t nrJO = _m_po->GetPOMDPDiscrete()->GetNrJointObservations();
    if( row.size() != nrJO)
    {
        stringstream ss; ss<<"ProcessORow: exected a row matrix with nrJO="<<nrJO<<" entries. Found "<<row.size()<< " entries. (at " <<str.get_position()<<")"<<endl; throw E(ss);
    }
    if( _m_po->_m_lp_toSI[0] == _m_po->_m_anyStateIndex )
    {
        _m_po->_m_lp_toSI.clear();
        for(Index si=0; si < nrS; si++)
            _m_po->_m_lp_toSI.push_back(si);
    }    
    vector<Index>::iterator sI_it = _m_po->_m_lp_toSI.begin();
    vector<Index>::iterator sI_last = _m_po->_m_lp_toSI.end();
    while(sI_it != sI_last)
    {
        Index sucSI = *sI_it;
        vector<Index>::iterator jaI_it = _m_po->_m_lp_JAI.begin();
        vector<Index>::iterator jaI_last = _m_po->_m_lp_JAI.end();
        while(jaI_it != jaI_last)
        {
            Index jaI = *jaI_it;
            for(Index joI=0; joI < nrJO; joI++)
            {
                _m_po->GetPOMDPDiscrete()->SetObservationProbability
                    (jaI, sucSI, joI, row[joI]);
                if(DEBUG_POMDP_PARSE)
                    cout << "Setting O("<<jaI<<","<<sucSI<<","<<joI<< ") = "<<row[joI]<<endl;
            }
            jaI_it++;
        }
        sI_it++;
    }
}